

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe12At4(uint8_t *buf)

{
  return (ulong)((*buf & 0xf) << 8) | (ulong)buf[1];
}

Assistant:

std::uint64_t readFlUIntBe12At4(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res &= UINT64_C(0xfff);
    return res;
}